

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

int Wlc_NtkCreateLevelsRev(Wlc_Ntk_t *p)

{
  long lVar1;
  Wlc_Obj_t *pWVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar13;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar12;
  
  uVar3 = p->iObj;
  if ((p->vLevels).nCap < (int)uVar3) {
    piVar8 = (p->vLevels).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar3 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar3 << 2);
    }
    (p->vLevels).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vLevels).nCap = uVar3;
  }
  if (0 < (int)uVar3) {
    memset((p->vLevels).pArray,0,(ulong)uVar3 * 4);
  }
  (p->vLevels).nSize = uVar3;
  iVar7 = 0;
  if (1 < (long)p->iObj) {
    iVar7 = 0;
    lVar9 = (long)p->iObj;
    do {
      if (p->nObjsAlloc < lVar9) goto LAB_00367881;
      lVar1 = lVar9 + -1;
      if ((undefined1  [24])((undefined1  [24])p->pObjs[lVar1] & (undefined1  [24])0x3d) !=
          (undefined1  [24])0x1) {
        if ((p->vLevels).nSize < lVar9) goto LAB_00367862;
        pWVar2 = p->pObjs + lVar1;
        iVar4 = (p->vLevels).pArray[lVar1];
        iVar5 = iVar4 + 1;
        uVar13 = (ulong)pWVar2->nFanins;
        if (0 < (int)pWVar2->nFanins) {
          lVar10 = 0;
          do {
            if ((2 < (uint)uVar13) ||
               (paVar12 = &pWVar2->field_10,
               (undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x2f) ==
               (undefined1  [24])0x6)) {
              paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar2->field_10).pFanins[0];
            }
            lVar11 = (long)paVar12->Fanins[lVar10];
            if ((lVar11 < 0) || ((p->vLevels).nSize <= paVar12->Fanins[lVar10])) goto LAB_00367862;
            piVar8 = (p->vLevels).pArray;
            if (piVar8[lVar11] <= iVar4) {
              piVar8[lVar11] = iVar5;
            }
            lVar10 = lVar10 + 1;
            uVar13 = (ulong)(int)pWVar2->nFanins;
          } while (lVar10 < (long)uVar13);
        }
        if (iVar7 <= iVar5) {
          iVar7 = iVar5;
        }
      }
      bVar6 = 2 < lVar9;
      lVar9 = lVar1;
    } while (bVar6);
  }
  if (1 < p->iObj) {
    lVar9 = 1;
    do {
      if (p->nObjsAlloc <= lVar9) goto LAB_00367881;
      if ((p->vLevels).nSize <= lVar9) {
LAB_00367862:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((p->vLevels).nSize <= lVar9) goto LAB_003678a0;
      piVar8 = (p->vLevels).pArray;
      piVar8[lVar9] = iVar7 - piVar8[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 < p->iObj);
  }
  if (0 < (p->vCis).nSize) {
    piVar8 = (p->vCis).pArray;
    lVar9 = 0;
    do {
      iVar5 = piVar8[lVar9];
      if (((long)iVar5 < 1) || (p->nObjsAlloc <= iVar5)) {
LAB_00367881:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((p->vLevels).nSize <= iVar5) {
LAB_003678a0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vLevels).pArray[iVar5] = 0;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vCis).nSize);
  }
  return iVar7;
}

Assistant:

int Wlc_NtkCreateLevelsRev( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, iFanin, Level, LevelMax = 0;
    Vec_IntFill( &p->vLevels, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObjReverse( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) )
            continue;
        Level = Wlc_ObjLevel(p, pObj) + 1;
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Vec_IntUpdateEntry( &p->vLevels, iFanin, Level );
        LevelMax = Abc_MaxInt( LevelMax, Level );
    }
    // reverse the values
    Wlc_NtkForEachObj( p, pObj, i )
        Vec_IntWriteEntry( &p->vLevels, i, LevelMax - Wlc_ObjLevelId(p, i) );
    Wlc_NtkForEachCi( p, pObj, i )
        Vec_IntWriteEntry( &p->vLevels, Wlc_ObjId(p, pObj), 0 );
    //Wlc_NtkForEachObj( p, pObj, i )
    //    printf( "%d -> %d\n", i, Wlc_ObjLevelId(p, i) );
    return LevelMax;
}